

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O2

void __thiscall OpenMD::GofRTheta::processHistogram(GofRTheta *this)

{
  int iVar1;
  int iVar2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  pointer piVar6;
  pointer pvVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  RealType RVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  iVar1 = (this->super_GofRAngle).super_RadialDistrFunc.nPairs_;
  RVar13 = Snapshot::getVolume(((this->super_GofRAngle).super_RadialDistrFunc.super_StaticAnalyser.
                               info_)->sman_->currentSnapshot_);
  iVar2 = (this->super_GofRAngle).nAngleBins_;
  pvVar3 = (this->super_GofRAngle).histogram_.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->super_GofRAngle).histogram_.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  dVar14 = 0.0;
  for (uVar9 = 0; uVar10 = (ulong)uVar9, uVar10 < (ulong)(((long)pvVar4 - (long)pvVar3) / 0x18);
      uVar9 = uVar9 + 1) {
    dVar15 = (this->super_GofRAngle).deltaR_;
    dVar16 = dVar15 * dVar14;
    dVar15 = dVar15 + dVar16;
    lVar5 = *(long *)&pvVar3[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    piVar6 = *(pointer *)
              ((long)&pvVar3[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data + 8);
    pvVar7 = (this->super_GofRAngle).avgGofr_.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar11 = 0; uVar12 = (ulong)uVar11, uVar12 < (ulong)((long)piVar6 - lVar5 >> 2);
        uVar11 = uVar11 + 1) {
      lVar8 = *(long *)&pvVar7[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar8 + uVar12 * 8) =
           (double)*(int *)(lVar5 + uVar12 * 4) /
           ((dVar15 * dVar15 * dVar15 - dVar16 * dVar16 * dVar16) *
           ((((double)iVar1 / RVar13) * 12.566370614359172) / ((double)iVar2 * 3.0))) +
           *(double *)(lVar8 + uVar12 * 8);
    }
    dVar14 = dVar14 + 1.0;
  }
  return;
}

Assistant:

void GofRTheta::processHistogram() {
    int nPairs = getNPairs();
    RealType volume =
        info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();
    RealType pairDensity = nPairs / volume;
    RealType pairConstant =
        (4.0 * Constants::PI * pairDensity) / (3.0 * (double)nAngleBins_);

    for (unsigned int i = 0; i < histogram_.size(); ++i) {
      RealType rLower = i * deltaR_;
      RealType rUpper = rLower + deltaR_;
      RealType volSlice =
          (rUpper * rUpper * rUpper) - (rLower * rLower * rLower);
      RealType nIdeal = volSlice * pairConstant;

      for (unsigned int j = 0; j < histogram_[i].size(); ++j) {
        avgGofr_[i][j] += histogram_[i][j] / nIdeal;
      }
    }
  }